

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O0

void resolve_common_syms(TCCState *s1)

{
  uchar *puVar1;
  size_t sVar2;
  uchar *local_18;
  Elf64_Sym *sym;
  TCCState *s1_local;
  
  local_18 = symtab_section->data;
  while (puVar1 = local_18, local_18 = puVar1 + 0x18,
        local_18 < symtab_section->data + symtab_section->data_offset) {
    if (*(short *)(puVar1 + 0x1e) == -0xe) {
      sVar2 = section_add(bss_section,*(Elf64_Addr *)(puVar1 + 0x28),
                          (int)*(undefined8 *)(puVar1 + 0x20));
      *(size_t *)(puVar1 + 0x20) = sVar2;
      *(short *)(puVar1 + 0x1e) = (short)bss_section->sh_num;
    }
  }
  tcc_add_linker_symbols(s1);
  return;
}

Assistant:

ST_FUNC void resolve_common_syms(TCCState* s1) {
  ElfW(Sym) * sym;

  /* Allocate common symbols in BSS.  */
  for_each_elem(symtab_section, 1, sym, ElfW(Sym)) {
    if (sym->st_shndx == SHN_COMMON) {
      /* symbol alignment is in st_value for SHN_COMMONs */
      sym->st_value = section_add(bss_section, sym->st_size, sym->st_value);
      sym->st_shndx = bss_section->sh_num;
    }
  }

  /* Now assign linker provided symbols their value.  */
  tcc_add_linker_symbols(s1);
}